

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.cpp
# Opt level: O1

void __thiscall
csv::internals::IBasicCSVParser::IBasicCSVParser
          (IBasicCSVParser *this,CSVFormat *format,ColNamesPtr *col_names)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  pointer pcVar3;
  char cVar4;
  char delimiter;
  long lVar5;
  long lVar6;
  array<csv::internals::ParseFlags,_256UL> ret;
  ParseFlagMap local_428;
  
  this->_vptr_IBasicCSVParser = (_func_int **)&PTR__IBasicCSVParser_00112aa8;
  (this->current_row).data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->current_row).data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->current_row).data_start = 0;
  (this->current_row).fields_start = 0;
  (this->current_row).row_length = 0;
  (this->data_ptr).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->data_ptr).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_col_names).super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (col_names->super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
  p_Var1 = (col_names->super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_col_names).super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->fields = (CSVFieldList *)0x0;
  this->field_start = -1;
  this->field_length = 0;
  this->_eof = false;
  this->source_size = 0;
  this->quote_escape = false;
  this->field_has_double_quote = false;
  this->data_pos = 0;
  this->unicode_bom_scan = false;
  this->_utf8_bom = false;
  this->_records = (RowCollection *)0x0;
  if (format->no_quote == true) {
    cVar4 = CSVFormat::get_delim(format);
    make_parse_flags(&local_428,cVar4);
  }
  else {
    delimiter = CSVFormat::get_delim(format);
    cVar4 = format->quote_char;
    make_parse_flags(&local_428,delimiter);
    local_428._M_elems[(long)cVar4 + 0x80] = QUOTE;
  }
  memcpy(&this->_parse_flags,&local_428,0x400);
  pcVar2 = (format->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (format->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  memset(&local_428,0,0x100);
  lVar5 = -0x80;
  do {
    *(undefined1 *)((long)local_428._M_elems + lVar5 + 0x80) = 0;
    if (pcVar3 != pcVar2) {
      lVar6 = 0;
      do {
        if ((int)lVar5 == (int)pcVar2[lVar6]) {
          *(undefined1 *)((long)local_428._M_elems + lVar5 + 0x80) = 1;
        }
        lVar6 = lVar6 + 1;
      } while ((long)pcVar3 - (long)pcVar2 != lVar6);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x80);
  memcpy(&this->_ws_flags,&local_428,0x100);
  return;
}

Assistant:

CSV_INLINE IBasicCSVParser::IBasicCSVParser(
            const CSVFormat& format,
            const ColNamesPtr& col_names
        ) : _col_names(col_names) {
            if (format.no_quote) {
                _parse_flags = internals::make_parse_flags(format.get_delim());
            }
            else {
                _parse_flags = internals::make_parse_flags(format.get_delim(), format.quote_char);
            }

            _ws_flags = internals::make_ws_flags(
                format.trim_chars.data(), format.trim_chars.size()
            );
        }